

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.cc
# Opt level: O0

int print_hex(BIO *bp,uint8_t *data,size_t len,int off)

{
  int iVar1;
  char *pcVar2;
  ulong local_38;
  size_t i;
  int off_local;
  size_t len_local;
  uint8_t *data_local;
  BIO *bp_local;
  
  local_38 = 0;
  while( true ) {
    if (len <= local_38) {
      iVar1 = BIO_write((BIO *)bp,"\n",1);
      bp_local._4_4_ = (uint)(0 < iVar1);
      return bp_local._4_4_;
    }
    if ((local_38 % 0xf == 0) &&
       ((iVar1 = BIO_puts((BIO *)bp,"\n"), iVar1 < 1 ||
        (iVar1 = BIO_indent((BIO *)bp,off + 4,0x80), iVar1 == 0)))) break;
    pcVar2 = ":";
    if (local_38 + 1 == len) {
      pcVar2 = "";
    }
    iVar1 = BIO_printf((BIO *)bp,"%02x%s",(ulong)data[local_38],pcVar2);
    if (iVar1 < 1) {
      return 0;
    }
    local_38 = local_38 + 1;
  }
  return 0;
}

Assistant:

static int print_hex(BIO *bp, const uint8_t *data, size_t len, int off) {
  for (size_t i = 0; i < len; i++) {
    if ((i % 15) == 0) {
      if (BIO_puts(bp, "\n") <= 0 ||  //
          !BIO_indent(bp, off + 4, 128)) {
        return 0;
      }
    }
    if (BIO_printf(bp, "%02x%s", data[i], (i + 1 == len) ? "" : ":") <= 0) {
      return 0;
    }
  }
  if (BIO_write(bp, "\n", 1) <= 0) {
    return 0;
  }
  return 1;
}